

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O1

WavFileWriter * __thiscall WavFileWriter::WriteFrame(WavFileWriter *this,FrameBuffer *FB)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long lVar4;
  long in_RDX;
  long *plVar5;
  uint uVar6;
  ulong __n;
  void *__src;
  WavFileElement local_98;
  
  puVar1 = &FB[1].field_0x8;
  if (*(undefined1 **)&FB[1].field_0x8 == puVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  else if (*(long *)&FB[1].field_0x18 == 1) {
    Kumu::FileWriter::Write
              ((uchar *)this,(uint)*(undefined8 *)(*(long *)&FB[1].field_0x10 + 0x10),
               *(uint **)(in_RDX + 8));
  }
  else {
    if ((ulong)*(uint *)(in_RDX + 0x18) != 0) {
      __src = *(void **)(in_RDX + 8);
      pvVar2 = (void *)((ulong)*(uint *)(in_RDX + 0x18) + (long)__src);
      __n = (ulong)(*(uint *)&FB->field_0x18 >> 3);
      do {
        for (puVar3 = *(undefined8 **)puVar1; puVar3 != (undefined8 *)puVar1;
            puVar3 = (undefined8 *)*puVar3) {
          if (*(int *)&FB[1].field_0x20 != 0) {
            uVar6 = 0;
            do {
              lVar4 = puVar3[2];
              memcpy(*(void **)(lVar4 + 0x60),__src,__n);
              plVar5 = (long *)(lVar4 + 0x60);
              *plVar5 = *plVar5 + __n;
              __src = (void *)((long)__src + __n);
              uVar6 = uVar6 + 1;
            } while (uVar6 < *(uint *)&FB[1].field_0x20);
          }
        }
      } while (__src < pvVar2);
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    plVar5 = *(long **)puVar1;
    if ((plVar5 != (long *)puVar1) && (-1 < (this->m_ADesc).EditRate.Numerator)) {
      do {
        WavFileElement::Flush(&local_98);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_98);
        Kumu::Result_t::~Result_t((Result_t *)&local_98);
        plVar5 = (long *)*plVar5;
        if (plVar5 == (long *)puVar1) {
          return this;
        }
      } while (-1 < (this->m_ADesc).EditRate.Numerator);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
    WriteFrame(ASDCP::PCM::FrameBuffer& FB)
    {
      if ( m_OutFile.empty() )
	return ASDCP::RESULT_STATE;

      if ( m_OutFile.size() == 1 ) // no de-interleave needed, just write out the frame
	return m_OutFile.back()->Write(FB.RoData(), FB.Size(), 0);
 
      std::list<WavFileElement*>::iterator fi;
      ui32_t sample_size = m_ADesc.QuantizationBits / 8;
      const byte_t* p = FB.RoData();
      const byte_t* end_p = p + FB.Size();

      while ( p < end_p )
	{
	  for ( fi = m_OutFile.begin(); fi != m_OutFile.end(); fi++ )
	    {
	      for ( ui32_t c = 0; c < m_ChannelCount; c++ )
		{
		  (*fi)->WriteSample(p, sample_size);
		  p += sample_size;
		}
	    }
	}

      ASDCP::Result_t result = ASDCP::RESULT_OK;

      for ( fi = m_OutFile.begin(); fi != m_OutFile.end() && ASDCP_SUCCESS(result); fi++ )
	result = (*fi)->Flush();

      return result;
    }